

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

void N_VScale_MultiFab(Real c,N_Vector x,N_Vector z)

{
  int comp;
  MultiFab **ppMVar1;
  N_Vector in_RSI;
  N_Vector in_RDI;
  MultiFab *in_XMM0_Qa;
  MultiFab *unaff_retaddr;
  sunindextype nghost;
  sunindextype ncomp;
  MultiFab *mf_z;
  MultiFab *mf_x;
  int in_stack_ffffffffffffffcc;
  int num_comp;
  MultiFab *val;
  FabArrayBase *this;
  
  ppMVar1 = amrex::sundials::getMFptr(in_RDI);
  this = (FabArrayBase *)*ppMVar1;
  ppMVar1 = amrex::sundials::getMFptr(in_RSI);
  val = *ppMVar1;
  comp = amrex::FabArrayBase::nComp(this);
  num_comp = 0;
  amrex::MultiFab::Copy
            (unaff_retaddr,in_XMM0_Qa,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  amrex::MultiFab::mult((MultiFab *)this,(Real)val,comp,num_comp,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void N_VScale_MultiFab(amrex::Real c, N_Vector x, N_Vector z)
{
    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);

    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells

    amrex::MultiFab::Copy(*mf_z, *mf_x, 0, 0, ncomp, nghost);
    mf_z->mult(c, 0, ncomp, nghost);
}